

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O1

bool __thiscall wasm::WATParser::Lexer::takeUntilParen(Lexer *this)

{
  pointer pAVar1;
  bool bVar2;
  bool bVar3;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_50;
  bool local_30;
  
  bVar3 = this->pos != (this->buffer)._M_len;
  if ((bVar3) && (bVar2 = peekLParen(this), !bVar2)) {
    while (bVar2 = peekRParen(this), !bVar2) {
      takeString_abi_cxx11_
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,this);
      if (local_30 == true) {
        local_30 = false;
        if (local_50._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_50._M_value + 0x10)) {
          operator_delete((void *)local_50._M_value._M_dataplus._M_p,local_50._16_8_ + 1);
        }
      }
      else {
        this->pos = this->pos + 1;
        pAVar1 = (this->annotations).
                 super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->annotations).
            super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
            ._M_impl.super__Vector_impl_data._M_finish != pAVar1) {
          (this->annotations).
          super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          ._M_impl.super__Vector_impl_data._M_finish = pAVar1;
        }
        skipSpace(this);
      }
      bVar2 = this->pos == (this->buffer)._M_len;
      bVar3 = !bVar2;
      if (bVar2) {
        return bVar3;
      }
      bVar2 = peekLParen(this);
      if (bVar2) {
        return bVar3;
      }
    }
  }
  return bVar3;
}

Assistant:

bool takeUntilParen() {
    while (true) {
      if (empty()) {
        return false;
      }
      if (peekLParen() || peekRParen()) {
        return true;
      }
      // Do not count the parentheses in strings.
      if (takeString()) {
        continue;
      }
      ++pos;
      advance();
    }
  }